

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_frommesh.cpp
# Opt level: O2

uint __thiscall ON_NgonBoundaryComponent::IsBoundaryVertex(ON_NgonBoundaryComponent *this)

{
  bool bVar1;
  uint uVar2;
  
  uVar2 = 0;
  if ((this->m_type == Vertex) && (this->m_face_count == '\0')) {
    bVar1 = Internal_IsAttachedToTwo(this,Edge);
    if ((bVar1) && (uVar2 = 0, this->m_attached_to[0]->m_face_count == '\x01')) {
      uVar2 = (uint)(this->m_attached_to[1]->m_face_count == '\x01');
    }
  }
  return uVar2;
}

Assistant:

unsigned int ON_NgonBoundaryComponent::IsBoundaryVertex() const
{
  return
    ON_NgonBoundaryComponent::Type::Vertex == m_type
    && 0 == m_face_count
    && Internal_IsAttachedToTwo(ON_NgonBoundaryComponent::Type::Edge)
    && 1 == m_attached_to[0]->m_face_count
    && 1 == m_attached_to[1]->m_face_count
    ;
}